

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int m_gt_0(char *z)

{
  int iVar1;
  char *local_18;
  char *z_local;
  
  local_18 = z;
  while (iVar1 = isVowel(local_18), iVar1 != 0) {
    local_18 = local_18 + 1;
  }
  if (*local_18 == '\0') {
    z_local._4_4_ = 0;
  }
  else {
    while (iVar1 = isConsonant(local_18), iVar1 != 0) {
      local_18 = local_18 + 1;
    }
    z_local._4_4_ = (uint)(*local_18 != '\0');
  }
  return z_local._4_4_;
}

Assistant:

static int m_gt_0(const char *z){
  while( isVowel(z) ){ z++; }
  if( *z==0 ) return 0;
  while( isConsonant(z) ){ z++; }
  return *z!=0;
}